

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int type;
  int64_t sizes [1000];
  
  srand48(0x2a);
  fill_random(sizes,1000);
  for (lVar1 = 0; lVar1 != 1000; lVar1 = lVar1 + 1) {
    sizes[lVar1] = (long)((double)sizes[lVar1] * 4.656612873077393e-10 * 42000.0) + 1;
  }
  sizes[999] = 42000;
  for (type = 0; type != 0x15; type = type + 1) {
    run_tests(sizes,1000,type);
  }
  return 0;
}

Assistant:

int main(void) {
  int i = 0;
  int64_t sizes[TESTS];
  srand48(SEED);
  // stable_tests();
  fill_random(sizes, TESTS);

  for (i = 0; i < TESTS; i++) {
    RAND_RANGE(sizes[i], 1, MAXSIZE);
  }

  sizes[TESTS - 1] = MAXSIZE;

  for (i = 0; i < FILL_LAST_ELEMENT; i++) {
    int result = run_tests(sizes, TESTS, i);

    if (result) {
      return 1;
    }
  }

  return 0;
}